

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O1

vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> * __thiscall
SkipList::GetUpperNodes
          (vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *__return_storage_ptr__,
          SkipList *this,int inKey)

{
  pointer *pppNVar1;
  iterator __position;
  int iVar2;
  Node *__args;
  Node *pNVar3;
  
  pNVar3 = this->header->next;
  iVar2 = this->height;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::reserve
            (__return_storage_ptr__,(long)iVar2);
LAB_00102e04:
  do {
    if (iVar2 == 0) {
      if ((long)(__return_storage_ptr__->
                super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->
                super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == (long)this->height) {
        return __return_storage_ptr__;
      }
      __assert_fail("(height == upperNodes.size()) && \"upperNodes contains more nodes than height of list\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0x11b,"std::vector<Node *> SkipList::GetUpperNodes(const int) const");
    }
    iVar2 = iVar2 + -1;
    do {
      __args = pNVar3;
      if (__args == (Node *)0x0) {
        pNVar3 = (Node *)0x0;
        goto LAB_00102e04;
      }
    } while ((__args->key < inKey) && (pNVar3 = __args->next, __args->next != (Node *)0x0));
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SkipList::Node*,std::allocator<SkipList::Node*>>::
      _M_realloc_insert<SkipList::Node*const&>
                ((vector<SkipList::Node*,std::allocator<SkipList::Node*>> *)__return_storage_ptr__,
                 __position,&__args->prev);
    }
    else {
      *__position._M_current = __args->prev;
      pppNVar1 = &(__return_storage_ptr__->
                  super__Vector_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    pNVar3 = __args->prev->bot;
  } while( true );
}

Assistant:

std::vector<Node*> SkipList::GetUpperNodes(const int inKey) const
{
	Node* node = header->next;
	int lvl = height;
	std::vector<Node*> upperNodes;
	upperNodes.reserve(height);
	while (lvl-- != 0)
	{
		while (node)
		{
			if (node->key < inKey && node->next)
			{
				node = node->next;
			}
			else
			{
				upperNodes.push_back(node->prev);
				node = node->prev->bot;
				break;
			}
		}
	}

	assert((height == upperNodes.size()) && "upperNodes contains more nodes than height of list");

	return upperNodes;
}